

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# frm_driver.c
# Opt level: O2

int Inter_Field_Navigation(_func_int_FORM_ptr *fct,FORM *form)

{
  _Bool _Var1;
  int iVar2;
  
  _Var1 = _nc_Internal_Validation(form);
  if (_Var1) {
    if ((form != (FORM *)0x0) && (form->fieldterm != (_func_void_formnode_ptr *)0x0)) {
      *(byte *)&form->status = (byte)form->status | 2;
      (*form->fieldterm)(form);
      *(byte *)&form->status = (byte)form->status & 0xfd;
    }
    iVar2 = (*fct)(form);
    if ((form != (FORM *)0x0) && (form->fieldinit != (_func_void_formnode_ptr *)0x0)) {
      *(byte *)&form->status = (byte)form->status | 2;
      (*form->fieldinit)(form);
      *(byte *)&form->status = (byte)form->status & 0xfd;
    }
  }
  else {
    iVar2 = -0xd;
  }
  return iVar2;
}

Assistant:

static int Inter_Field_Navigation(int (* const fct) (FORM *),FORM *form)
{
  int res;

  if (!_nc_Internal_Validation(form)) 
    res = E_INVALID_FIELD;
  else
    {
      Call_Hook(form,fieldterm);
      res = fct(form);
      Call_Hook(form,fieldinit);
    }
  return res;
}